

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynBase * ParseArray(ParseContext *ctx)

{
  LexemeType LVar1;
  Lexeme *begin;
  Lexeme *pLVar2;
  int iVar3;
  undefined4 extraout_var;
  SynBase *pSVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  IntrusiveList<SynBase> IVar5;
  IntrusiveList<SynBase> values;
  IntrusiveList<SynBase> local_48;
  SynBase *local_38;
  SynBase *pSStack_30;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_ofigure) {
    ctx->currentLexeme = begin + 1;
    if (begin[1].type == lex_for) {
      IVar5 = ParseExpressions(ctx);
      anon_unknown.dwarf_15b62::CheckConsume
                (ctx,lex_cfigure,"ERROR: \'}\' not found after inline array");
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar4 = (SynBase *)CONCAT44(extraout_var,iVar3);
      if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_0011280c:
        __assert_fail("currentLexeme > firstLexeme",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                      ,0x19c,"Lexeme *ParseContext::Previous()");
      }
      SynBase::SynBase(pSVar4,0x14,begin,ctx->currentLexeme + -1);
      pSVar4->_vptr_SynBase = (_func_int **)&PTR__SynBase_00222590;
      *(IntrusiveList<SynBase> *)(pSVar4 + 1) = IVar5;
    }
    else {
      if (0xff < ctx->expressionBlockDepth) {
        anon_unknown.dwarf_15b62::Stop
                  (ctx,begin + 1,"ERROR: reached nested array limit of %d",0x100);
      }
      ctx->expressionBlockDepth = ctx->expressionBlockDepth + 1;
      local_48.head = (SynBase *)0x0;
      local_48.tail = (SynBase *)0x0;
      pSVar4 = ParseTernaryExpr(ctx);
      if (pSVar4 == (SynBase *)0x0) {
        anon_unknown.dwarf_15b62::Report
                  (ctx,ctx->currentLexeme,"ERROR: value not found after \'{\'");
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
        pSVar4 = (SynBase *)CONCAT44(extraout_var_00,iVar3);
        SynBase::SynBase(pSVar4,0,ctx->currentLexeme,ctx->currentLexeme);
        pSVar4->_vptr_SynBase = (_func_int **)&PTR__SynBase_00222408;
      }
      IntrusiveList<SynBase>::push_back(&local_48,pSVar4);
      pLVar2 = ctx->currentLexeme;
      LVar1 = pLVar2->type;
      while (LVar1 == lex_comma) {
        ctx->currentLexeme = pLVar2 + 1;
        pSVar4 = ParseTernaryExpr(ctx);
        if (pSVar4 == (SynBase *)0x0) {
          anon_unknown.dwarf_15b62::Report
                    (ctx,ctx->currentLexeme,"ERROR: value not found after \',\'");
        }
        else {
          IntrusiveList<SynBase>::push_back(&local_48,pSVar4);
        }
        pLVar2 = ctx->currentLexeme;
        LVar1 = pLVar2->type;
      }
      ctx->expressionBlockDepth = ctx->expressionBlockDepth - 1;
      anon_unknown.dwarf_15b62::CheckConsume
                (ctx,lex_cfigure,"ERROR: \'}\' not found after inline array");
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar4 = (SynBase *)CONCAT44(extraout_var_01,iVar3);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0011280c;
      local_38 = local_48.head;
      pSStack_30 = local_48.tail;
      SynBase::SynBase(pSVar4,0x13,begin,ctx->currentLexeme + -1);
      pSVar4->_vptr_SynBase = (_func_int **)&PTR__SynBase_002225c8;
      pSVar4[1]._vptr_SynBase = (_func_int **)local_38;
      *(SynBase **)&pSVar4[1].typeID = pSStack_30;
    }
  }
  else {
    pSVar4 = (SynBase *)0x0;
  }
  return pSVar4;
}

Assistant:

SynBase* ParseArray(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_ofigure))
	{
		if(ctx.At(lex_for))
		{
			IntrusiveList<SynBase> expressions = ParseExpressions(ctx);

			CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after inline array");

			return new (ctx.get<SynGenerator>()) SynGenerator(start, ctx.Previous(), expressions);
		}

		const unsigned blockLimit = 256;

		if(ctx.expressionBlockDepth >= blockLimit)
			Stop(ctx, ctx.Current(), "ERROR: reached nested array limit of %d", blockLimit);

		ctx.expressionBlockDepth++;

		IntrusiveList<SynBase> values;

		SynBase *value = ParseTernaryExpr(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: value not found after '{'");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		values.push_back(value);

		while(ctx.Consume(lex_comma))
		{
			value = ParseTernaryExpr(ctx);

			if(!value)
				Report(ctx, ctx.Current(), "ERROR: value not found after ','");
			else
				values.push_back(value);
		}

		ctx.expressionBlockDepth--;

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after inline array");

		return new (ctx.get<SynArray>()) SynArray(start, ctx.Previous(), values);
	}

	return NULL;
}